

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImg<unsigned_int> * __thiscall
cimg_library::CImg<unsigned_int>::get_index<unsigned_char>
          (CImg<unsigned_int> *__return_storage_ptr__,CImg<unsigned_int> *this,
          CImg<unsigned_char> *colormap,float dithering,bool map_indexes)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  CImgArgumentException *this_00;
  uint *puVar7;
  uchar *puVar8;
  byte *pbVar9;
  uchar *puVar10;
  long lVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  uchar *puVar16;
  float *pfVar17;
  float *pfVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float local_65c;
  float local_658;
  float local_640;
  float local_63c;
  float local_638;
  float local_634;
  float local_630;
  float local_62c;
  float local_618;
  float local_614;
  float local_610;
  float local_60c;
  float local_5f8;
  float local_5f4;
  float local_5c8;
  float local_5c4;
  uint local_5c0;
  int local_55c;
  uint *puStack_558;
  int c_5;
  tuint *_ptrd_1;
  byte *pbStack_548;
  int c_4;
  uchar *_ptrp_1;
  uint *_ptrs_3;
  Tfloat dist_7;
  uchar *ptrp_end_7;
  uchar *ptrp_1;
  uchar *ptrmin_1;
  Tfloat distmin_7;
  uint *ptrs_end_3;
  uint *ptrs_1;
  tuint *ptrd_4;
  int y_7;
  int z_7;
  Tfloat dist_6;
  Tfloat pval2_1;
  Tfloat pval1_3;
  Tfloat pval0_5;
  uchar *ptrp_end_6;
  uchar *ptrp2_1;
  uchar *ptrp1_3;
  uchar *ptrp0_5;
  uchar *ptrmin0_5;
  Tfloat distmin_6;
  Tfloat val2_1;
  Tfloat val1_3;
  Tfloat val0_5;
  uint *ptrs_end_2;
  uint *ptrs2_2;
  uint *ptrs1_5;
  uint *ptrs0_8;
  tuint *ptrd2_1;
  tuint *ptrd1_3;
  tuint *ptrd_3;
  uint local_468;
  int y_6;
  int z_6;
  Tfloat dist_5;
  Tfloat pval1_2;
  Tfloat pval0_4;
  uchar *ptrp_end_5;
  uchar *ptrp1_2;
  uchar *ptrp0_4;
  uchar *ptrmin0_4;
  Tfloat distmin_5;
  Tfloat val1_2;
  Tfloat val0_4;
  uint *ptrs_end_1;
  uint *ptrs1_4;
  uint *ptrs0_7;
  tuint *ptrd1_2;
  tuint *ptrd_2;
  int y_5;
  int z_5;
  Tfloat dist_4;
  Tfloat pval0_3;
  uchar *ptrp_end_4;
  uchar *ptrp0_3;
  uchar *ptrmin0_3;
  Tfloat distmin_4;
  Tfloat val0_3;
  uint *ptrs_end;
  uint *ptrs0_6;
  tuint *ptrd_1;
  uint local_3b0;
  int y_4;
  int z_4;
  int c_3;
  tuint *_ptrd;
  Tfloat err;
  int c_2;
  Tfloat *_ptrsn;
  Tfloat *_ptrs_1;
  uchar *_ptrmin;
  Tfloat val;
  Tfloat _val;
  int c_1;
  uchar *_ptrp;
  Tfloat *_ptrs_2;
  Tfloat dist_3;
  uchar *ptrp_end_3;
  uchar *ptrp;
  uchar *ptrmin;
  Tfloat distmin_3;
  int x_7;
  Tfloat *ptrsn;
  Tfloat *ptrs;
  uint *puStack_320;
  int x_6;
  uint *_ptrs;
  Tfloat *_ptrc;
  uint *puStack_308;
  int c;
  Tfloat *ptrc;
  uint local_2f8;
  int y_3;
  int z_3;
  Tfloat err2;
  Tfloat err1_1;
  Tfloat err0_2;
  uchar *ptrmin2;
  uchar *ptrmin1_1;
  Tfloat dist_2;
  Tfloat pval2;
  Tfloat pval1_1;
  Tfloat pval0_2;
  uchar *ptrp_end_2;
  uchar *ptrp2;
  uchar *ptrp1_1;
  uchar *ptrp0_2;
  uchar *ptrmin0_2;
  Tfloat distmin_2;
  Tfloat val2;
  Tfloat _val2;
  Tfloat val1_1;
  Tfloat _val1_1;
  Tfloat val0_2;
  Tfloat _val0_2;
  int x_5;
  Tfloat *ptrsn2;
  Tfloat *ptrsn1_1;
  Tfloat *ptrsn0_2;
  Tfloat *ptrs2;
  Tfloat *ptrs1_2;
  Tfloat *ptrs0_4;
  uint *puStack_248;
  int x_4;
  uint *ptrs2_1;
  uint *ptrs1_3;
  uint *ptrs0_5;
  Tfloat *ptrc2;
  Tfloat *ptrc1_1;
  Tfloat *ptrc0_2;
  int y_2;
  int z_2;
  tuint *ptrd2;
  tuint *ptrd1_1;
  Tfloat err1;
  Tfloat err0_1;
  uchar *ptrmin1;
  Tfloat dist_1;
  Tfloat pval1;
  Tfloat pval0_1;
  uchar *ptrp_end_1;
  uchar *ptrp1;
  uchar *ptrp0_1;
  uchar *ptrmin0_1;
  Tfloat distmin_1;
  Tfloat val1;
  Tfloat _val1;
  Tfloat val0_1;
  Tfloat _val0_1;
  int x_3;
  Tfloat *ptrsn1;
  Tfloat *ptrsn0_1;
  Tfloat *ptrs1;
  Tfloat *ptrs0_2;
  uint *puStack_180;
  int x_2;
  uint *ptrs1_1;
  uint *ptrs0_3;
  Tfloat *ptrc1;
  Tfloat *ptrc0_1;
  int y_1;
  int z_1;
  tuint *ptrd1;
  Tfloat err0;
  Tfloat dist;
  Tfloat pval0;
  uchar *ptrp_end;
  uchar *ptrp0;
  uchar *ptrmin0;
  Tfloat distmin;
  Tfloat val0;
  Tfloat _val0;
  int x_1;
  Tfloat *ptrsn0;
  Tfloat *ptrs0;
  uint *puStack_100;
  int x;
  uint *ptrs0_1;
  Tfloat *ptrc0;
  int y;
  int z;
  unsigned_long cwhd;
  Tfloat *cache_next;
  Tfloat *cache_current;
  undefined1 local_b0 [8];
  CImg<float> cache;
  float local_88;
  Tfloat valM;
  Tfloat valm;
  float ndithering;
  tuint *ptrd;
  long local_70;
  unsigned_long pwhd;
  unsigned_long whd;
  byte local_4d;
  float local_4c;
  bool map_indexes_local;
  CImg<unsigned_char> *pCStack_48;
  float dithering_local;
  CImg<unsigned_char> *colormap_local;
  CImg<unsigned_int> *this_local;
  CImg<unsigned_int> *res;
  
  local_4d = map_indexes;
  local_4c = dithering;
  pCStack_48 = colormap;
  colormap_local = (CImg<unsigned_char> *)this;
  this_local = __return_storage_ptr__;
  if (colormap->_spectrum == this->_spectrum) {
    bVar5 = is_empty(this);
    if (bVar5) {
      CImg(__return_storage_ptr__);
    }
    else {
      pwhd = (ulong)this->_width * (ulong)this->_height * (ulong)this->_depth;
      local_70 = (ulong)pCStack_48->_width * (ulong)pCStack_48->_height * (ulong)pCStack_48->_depth;
      ptrd._7_1_ = 0;
      if ((local_4d & 1) == 0) {
        local_5c0 = 1;
      }
      else {
        local_5c0 = this->_spectrum;
      }
      CImg(__return_storage_ptr__,this->_width,this->_height,this->_depth,local_5c0);
      _valm = __return_storage_ptr__->_data;
      if (local_4c <= 0.0) {
        uVar1 = this->_spectrum;
        if (uVar1 == 1) {
          for (local_3b0 = 0; (int)local_3b0 < (int)this->_depth; local_3b0 = local_3b0 + 1) {
            for (ptrd_1._4_4_ = 0; (int)ptrd_1._4_4_ < (int)this->_height;
                ptrd_1._4_4_ = ptrd_1._4_4_ + 1) {
              ptrs0_6 = data(__return_storage_ptr__,0,ptrd_1._4_4_,local_3b0,0);
              puVar7 = data(this,0,ptrd_1._4_4_,local_3b0,0);
              uVar1 = this->_width;
              ptrs_end = puVar7;
              while (ptrs_end < puVar7 + uVar1) {
                uVar2 = *ptrs_end;
                ptrmin0_3._0_4_ = cimg::type<float>::max();
                ptrp0_3 = pCStack_48->_data;
                puVar10 = pCStack_48->_data;
                while (ptrp_end_4 = puVar10, ptrp_end_4 < pCStack_48->_data + local_70) {
                  fVar21 = ((float)*ptrp_end_4 - (float)uVar2) * ((float)*ptrp_end_4 - (float)uVar2)
                  ;
                  puVar10 = ptrp_end_4 + 1;
                  if (fVar21 < ptrmin0_3._0_4_) {
                    ptrp0_3 = ptrp_end_4;
                    ptrmin0_3._0_4_ = fVar21;
                  }
                }
                if ((local_4d & 1) == 0) {
                  *ptrs0_6 = (int)ptrp0_3 - (int)pCStack_48->_data;
                }
                else {
                  *ptrs0_6 = (uint)*ptrp0_3;
                }
                ptrs0_6 = ptrs0_6 + 1;
                ptrs_end = ptrs_end + 1;
              }
            }
          }
        }
        else if (uVar1 == 2) {
          for (ptrd_2._4_4_ = 0; (int)ptrd_2._4_4_ < (int)this->_depth;
              ptrd_2._4_4_ = ptrd_2._4_4_ + 1) {
            for (ptrd_2._0_4_ = 0; (int)(uint)ptrd_2 < (int)this->_height;
                ptrd_2._0_4_ = (uint)ptrd_2 + 1) {
              ptrd1_2 = data(__return_storage_ptr__,0,(uint)ptrd_2,ptrd_2._4_4_,0);
              ptrs0_7 = ptrd1_2 + pwhd;
              puVar7 = data(this,0,(uint)ptrd_2,ptrd_2._4_4_,0);
              uVar1 = this->_width;
              ptrs_end_1 = puVar7 + pwhd;
              ptrs1_4 = puVar7;
              while (ptrs1_4 < puVar7 + uVar1) {
                uVar2 = *ptrs1_4;
                uVar3 = *ptrs_end_1;
                ptrmin0_4._4_4_ = cimg::type<float>::max();
                ptrp0_4 = pCStack_48->_data;
                puVar8 = pCStack_48->_data + local_70;
                ptrp_end_5 = puVar8;
                puVar10 = pCStack_48->_data;
                while (ptrp1_2 = puVar10, ptrp1_2 < puVar8) {
                  puVar10 = ptrp_end_5 + 1;
                  fVar21 = ((float)*ptrp1_2 - (float)uVar2) * ((float)*ptrp1_2 - (float)uVar2) +
                           ((float)*ptrp_end_5 - (float)uVar3) * ((float)*ptrp_end_5 - (float)uVar3)
                  ;
                  ptrp_end_5 = puVar10;
                  puVar10 = ptrp1_2 + 1;
                  if (fVar21 < ptrmin0_4._4_4_) {
                    ptrp0_4 = ptrp1_2;
                    ptrmin0_4._4_4_ = fVar21;
                  }
                }
                if ((local_4d & 1) == 0) {
                  *ptrd1_2 = (int)ptrp0_4 - (int)pCStack_48->_data;
                }
                else {
                  *ptrd1_2 = (uint)*ptrp0_4;
                  *ptrs0_7 = (uint)ptrp0_4[local_70];
                  ptrs0_7 = ptrs0_7 + 1;
                }
                ptrd1_2 = ptrd1_2 + 1;
                ptrs_end_1 = ptrs_end_1 + 1;
                ptrs1_4 = ptrs1_4 + 1;
              }
            }
          }
        }
        else if (uVar1 == 3) {
          for (local_468 = 0; (int)local_468 < (int)this->_depth; local_468 = local_468 + 1) {
            for (ptrd_3._4_4_ = 0; (int)ptrd_3._4_4_ < (int)this->_height;
                ptrd_3._4_4_ = ptrd_3._4_4_ + 1) {
              ptrd1_3 = data(__return_storage_ptr__,0,ptrd_3._4_4_,local_468,0);
              ptrd2_1 = ptrd1_3 + pwhd;
              ptrs0_8 = ptrd2_1 + pwhd;
              puVar7 = data(this,0,ptrd_3._4_4_,local_468,0);
              uVar1 = this->_width;
              ptrs_end_2 = puVar7 + pwhd + pwhd;
              ptrs2_2 = puVar7 + pwhd;
              ptrs1_5 = puVar7;
              while (ptrs1_5 < puVar7 + uVar1) {
                uVar2 = *ptrs1_5;
                uVar3 = *ptrs2_2;
                uVar4 = *ptrs_end_2;
                ptrmin0_5._0_4_ = cimg::type<float>::max();
                ptrp0_5 = pCStack_48->_data;
                puVar8 = pCStack_48->_data + local_70;
                ptrp_end_6 = puVar8 + local_70;
                ptrp2_1 = puVar8;
                puVar10 = pCStack_48->_data;
                while (ptrp1_3 = puVar10, ptrp1_3 < puVar8) {
                  puVar10 = ptrp2_1 + 1;
                  puVar16 = ptrp_end_6 + 1;
                  fVar21 = ((float)*ptrp_end_6 - (float)uVar4) * ((float)*ptrp_end_6 - (float)uVar4)
                           + ((float)*ptrp1_3 - (float)uVar2) * ((float)*ptrp1_3 - (float)uVar2) +
                             ((float)*ptrp2_1 - (float)uVar3) * ((float)*ptrp2_1 - (float)uVar3);
                  ptrp_end_6 = puVar16;
                  ptrp2_1 = puVar10;
                  puVar10 = ptrp1_3 + 1;
                  if (fVar21 < ptrmin0_5._0_4_) {
                    ptrp0_5 = ptrp1_3;
                    ptrmin0_5._0_4_ = fVar21;
                  }
                }
                if ((local_4d & 1) == 0) {
                  *ptrd1_3 = (int)ptrp0_5 - (int)pCStack_48->_data;
                }
                else {
                  *ptrd1_3 = (uint)*ptrp0_5;
                  *ptrd2_1 = (uint)ptrp0_5[local_70];
                  *ptrs0_8 = (uint)ptrp0_5[local_70 * 2];
                  ptrs0_8 = ptrs0_8 + 1;
                  ptrd2_1 = ptrd2_1 + 1;
                }
                ptrd1_3 = ptrd1_3 + 1;
                ptrs_end_2 = ptrs_end_2 + 1;
                ptrs2_2 = ptrs2_2 + 1;
                ptrs1_5 = ptrs1_5 + 1;
              }
            }
          }
        }
        else {
          for (ptrd_4._4_4_ = 0; (int)ptrd_4._4_4_ < (int)this->_depth;
              ptrd_4._4_4_ = ptrd_4._4_4_ + 1) {
            for (ptrd_4._0_4_ = 0; (int)(uint)ptrd_4 < (int)this->_height;
                ptrd_4._0_4_ = (uint)ptrd_4 + 1) {
              ptrs_1 = data(__return_storage_ptr__,0,(uint)ptrd_4,ptrd_4._4_4_,0);
              ptrs_end_3 = data(this,0,(uint)ptrd_4,ptrd_4._4_4_,0);
              puVar7 = ptrs_end_3 + this->_width;
              for (; ptrs_end_3 < puVar7; ptrs_end_3 = ptrs_end_3 + 1) {
                ptrmin_1._4_4_ = cimg::type<float>::max();
                ptrp_1 = pCStack_48->_data;
                ptrp_end_7 = pCStack_48->_data;
                puVar10 = ptrp_end_7 + local_70;
                for (; ptrp_end_7 < puVar10; ptrp_end_7 = ptrp_end_7 + 1) {
                  _ptrs_3._4_4_ = 0.0;
                  _ptrp_1 = (uchar *)ptrs_end_3;
                  pbStack_548 = ptrp_end_7;
                  for (_ptrd_1._4_4_ = 0; _ptrd_1._4_4_ < (int)this->_spectrum;
                      _ptrd_1._4_4_ = _ptrd_1._4_4_ + 1) {
                    fVar21 = cimg::sqr<float>((float)*(uint *)_ptrp_1 - (float)*pbStack_548);
                    _ptrs_3._4_4_ = fVar21 + _ptrs_3._4_4_;
                    _ptrp_1 = _ptrp_1 + pwhd * 4;
                    pbStack_548 = pbStack_548 + local_70;
                  }
                  if (_ptrs_3._4_4_ < ptrmin_1._4_4_) {
                    ptrp_1 = ptrp_end_7;
                    ptrmin_1._4_4_ = _ptrs_3._4_4_;
                  }
                }
                if ((local_4d & 1) == 0) {
                  *ptrs_1 = (int)ptrp_1 - (int)pCStack_48->_data;
                }
                else {
                  puStack_558 = ptrs_1;
                  for (local_55c = 0; local_55c < (int)this->_spectrum; local_55c = local_55c + 1) {
                    *puStack_558 = (uint)*ptrp_1;
                    puStack_558 = puStack_558 + pwhd;
                    ptrp_1 = ptrp_1 + local_70;
                  }
                }
                ptrs_1 = ptrs_1 + 1;
              }
            }
          }
        }
      }
      else {
        if (0.0 <= local_4c) {
          if (local_4c <= 1.0) {
            local_5c8 = local_4c;
          }
          else {
            local_5c8 = 1.0;
          }
          local_5c4 = local_5c8;
        }
        else {
          local_5c4 = 0.0;
        }
        valM = local_5c4 * 0.0625;
        local_88 = 0.0;
        puVar7 = max_min<float>(this,&local_88);
        cache._data._4_4_ = (float)*puVar7;
        if (((local_88 == cache._data._4_4_) && (0.0 <= local_88)) && (cache._data._4_4_ <= 255.0))
        {
          local_88 = 0.0;
          cache._data._4_4_ = 255.0;
        }
        get_crop((CImg<unsigned_int> *)&cache_current,this,-1,0,0,0,this->_width,1,0,
                 this->_spectrum - 1,false);
        CImg<float>::CImg<unsigned_int>
                  ((CImg<float> *)local_b0,(CImg<unsigned_int> *)&cache_current);
        ~CImg((CImg<unsigned_int> *)&cache_current);
        cache_next = CImg<float>::data((CImg<float> *)local_b0,1,0,0,0);
        cwhd = (unsigned_long)CImg<float>::data((CImg<float> *)local_b0,1,1,0,0);
        lVar11 = (ulong)(uint)local_b0._0_4_ * (ulong)(uint)local_b0._4_4_ * (ulong)cache._width;
        uVar1 = this->_spectrum;
        if (uVar1 == 1) {
          for (ptrc0._4_4_ = 0; (int)ptrc0._4_4_ < (int)this->_depth; ptrc0._4_4_ = ptrc0._4_4_ + 1)
          {
            for (ptrc0._0_4_ = 0; (int)ptrc0 < (int)this->_height; ptrc0._0_4_ = (int)ptrc0 + 1) {
              iVar6 = height(this);
              if ((int)ptrc0 < iVar6 + -2) {
                ptrs0_1 = (uint *)cwhd;
                puStack_100 = data(this,0,(int)ptrc0 + 1,ptrc0._4_4_,0);
                for (ptrs0._4_4_ = 0; ptrs0._4_4_ < (int)this->_width; ptrs0._4_4_ = ptrs0._4_4_ + 1
                    ) {
                  *ptrs0_1 = (uint)(float)*puStack_100;
                  puStack_100 = puStack_100 + 1;
                  ptrs0_1 = ptrs0_1 + 1;
                }
              }
              ptrsn0 = cache_next;
              __val0 = (float *)cwhd;
              for (val0 = 0.0; (int)val0 < (int)this->_width; val0 = (Tfloat)((int)val0 + 1)) {
                local_5f8 = *ptrsn0;
                if (local_88 <= local_5f8) {
                  if (cache._data._4_4_ < local_5f8) {
                    local_5f8 = cache._data._4_4_;
                  }
                  local_5f4 = local_5f8;
                }
                else {
                  local_5f4 = local_88;
                }
                ptrmin0._0_4_ = cimg::type<float>::max();
                ptrp0 = pCStack_48->_data;
                puVar10 = pCStack_48->_data;
                while (ptrp_end = puVar10, ptrp_end < pCStack_48->_data + local_70) {
                  fVar21 = ((float)*ptrp_end - local_5f4) * ((float)*ptrp_end - local_5f4);
                  puVar10 = ptrp_end + 1;
                  if (fVar21 < ptrmin0._0_4_) {
                    ptrp0 = ptrp_end;
                    ptrmin0._0_4_ = fVar21;
                  }
                }
                pfVar12 = ptrsn0 + 1;
                *ptrsn0 = local_5f4;
                fVar21 = (local_5f4 - (float)*ptrp0) * valM;
                *pfVar12 = fVar21 * 7.0 + *pfVar12;
                __val0[-1] = fVar21 * 3.0 + __val0[-1];
                pfVar13 = __val0 + 1;
                *__val0 = fVar21 * 5.0 + *__val0;
                *pfVar13 = fVar21 + *pfVar13;
                if ((local_4d & 1) == 0) {
                  *_valm = (int)ptrp0 - (int)pCStack_48->_data;
                }
                else {
                  *_valm = (uint)*ptrp0;
                }
                _valm = _valm + 1;
                __val0 = pfVar13;
                ptrsn0 = pfVar12;
              }
              cimg::swap<float*>(&cache_next,(float **)&cwhd);
            }
          }
        }
        else if (uVar1 == 2) {
          _y_1 = _valm + pwhd;
          for (ptrc0_1._4_4_ = 0; (int)ptrc0_1._4_4_ < (int)this->_depth;
              ptrc0_1._4_4_ = ptrc0_1._4_4_ + 1) {
            for (ptrc0_1._0_4_ = 0; (int)ptrc0_1 < (int)this->_height;
                ptrc0_1._0_4_ = (int)ptrc0_1 + 1) {
              iVar6 = height(this);
              if ((int)ptrc0_1 < iVar6 + -2) {
                ptrc1 = (Tfloat *)cwhd;
                ptrs0_3 = (uint *)(cwhd + lVar11 * 4);
                ptrs1_1 = data(this,0,(int)ptrc0_1 + 1,ptrc0_1._4_4_,0);
                puStack_180 = ptrs1_1 + pwhd;
                for (ptrs0_2._4_4_ = 0; ptrs0_2._4_4_ < (int)this->_width;
                    ptrs0_2._4_4_ = ptrs0_2._4_4_ + 1) {
                  *ptrc1 = (float)*ptrs1_1;
                  *ptrs0_3 = (uint)(float)*puStack_180;
                  puStack_180 = puStack_180 + 1;
                  ptrs1_1 = ptrs1_1 + 1;
                  ptrs0_3 = ptrs0_3 + 1;
                  ptrc1 = ptrc1 + 1;
                }
              }
              ptrs1 = cache_next;
              ptrsn1 = (Tfloat *)cwhd;
              __val0_1 = (float *)(cwhd + lVar11 * 4);
              ptrsn0_1 = cache_next + lVar11;
              for (val0_1 = 0.0; (int)val0_1 < (int)this->_width; val0_1 = (Tfloat)((int)val0_1 + 1)
                  ) {
                local_610 = *ptrs1;
                if (local_88 <= local_610) {
                  if (cache._data._4_4_ < local_610) {
                    local_610 = cache._data._4_4_;
                  }
                  local_60c = local_610;
                }
                else {
                  local_60c = local_88;
                }
                local_618 = *ptrsn0_1;
                if (local_88 <= local_618) {
                  if (cache._data._4_4_ < local_618) {
                    local_618 = cache._data._4_4_;
                  }
                  local_614 = local_618;
                }
                else {
                  local_614 = local_88;
                }
                ptrmin0_1._0_4_ = cimg::type<float>::max();
                ptrp0_1 = pCStack_48->_data;
                puVar8 = pCStack_48->_data + local_70;
                ptrp_end_1 = puVar8;
                puVar10 = pCStack_48->_data;
                while (ptrp1 = puVar10, ptrp1 < puVar8) {
                  puVar10 = ptrp_end_1 + 1;
                  fVar21 = ((float)*ptrp1 - local_60c) * ((float)*ptrp1 - local_60c) +
                           ((float)*ptrp_end_1 - local_614) * ((float)*ptrp_end_1 - local_614);
                  ptrp_end_1 = puVar10;
                  puVar10 = ptrp1 + 1;
                  if (fVar21 < ptrmin0_1._0_4_) {
                    ptrp0_1 = ptrp1;
                    ptrmin0_1._0_4_ = fVar21;
                  }
                }
                pfVar12 = ptrs1 + 1;
                *ptrs1 = local_60c;
                fVar21 = (local_60c - (float)*ptrp0_1) * valM;
                pfVar13 = ptrsn0_1 + 1;
                *ptrsn0_1 = local_614;
                fVar19 = (local_614 - (float)ptrp0_1[local_70]) * valM;
                *pfVar12 = fVar21 * 7.0 + *pfVar12;
                *pfVar13 = fVar19 * 7.0 + *pfVar13;
                ptrsn1[-1] = fVar21 * 3.0 + ptrsn1[-1];
                __val0_1[-1] = fVar19 * 3.0 + __val0_1[-1];
                pfVar14 = ptrsn1 + 1;
                *ptrsn1 = fVar21 * 5.0 + *ptrsn1;
                pfVar15 = __val0_1 + 1;
                *__val0_1 = fVar19 * 5.0 + *__val0_1;
                *pfVar14 = fVar21 + *pfVar14;
                *pfVar15 = fVar19 + *pfVar15;
                if ((local_4d & 1) == 0) {
                  *_valm = (int)ptrp0_1 - (int)pCStack_48->_data;
                }
                else {
                  *_valm = (uint)*ptrp0_1;
                  *_y_1 = (uint)ptrp0_1[local_70];
                  _y_1 = _y_1 + 1;
                }
                _valm = _valm + 1;
                __val0_1 = pfVar15;
                ptrsn1 = pfVar14;
                ptrsn0_1 = pfVar13;
                ptrs1 = pfVar12;
              }
              cimg::swap<float*>(&cache_next,(float **)&cwhd);
            }
          }
        }
        else if (uVar1 == 3) {
          ptrd2 = _valm + pwhd;
          _y_2 = ptrd2 + pwhd;
          for (ptrc0_2._4_4_ = 0; (int)ptrc0_2._4_4_ < (int)this->_depth;
              ptrc0_2._4_4_ = ptrc0_2._4_4_ + 1) {
            for (ptrc0_2._0_4_ = 0; (int)ptrc0_2 < (int)this->_height;
                ptrc0_2._0_4_ = (int)ptrc0_2 + 1) {
              iVar6 = height(this);
              if ((int)ptrc0_2 < iVar6 + -2) {
                ptrc1_1 = (Tfloat *)cwhd;
                ptrc2 = (Tfloat *)(cwhd + lVar11 * 4);
                ptrs1_3 = data(this,0,(int)ptrc0_2 + 1,ptrc0_2._4_4_,0);
                puStack_248 = ptrs1_3 + pwhd + pwhd;
                ptrs2_1 = ptrs1_3 + pwhd;
                ptrs0_5 = (uint *)(ptrc2 + lVar11);
                for (ptrs0_4._4_4_ = 0; ptrs0_4._4_4_ < (int)this->_width;
                    ptrs0_4._4_4_ = ptrs0_4._4_4_ + 1) {
                  *ptrc1_1 = (float)*ptrs1_3;
                  *ptrc2 = (float)*ptrs2_1;
                  *ptrs0_5 = (uint)(float)*puStack_248;
                  puStack_248 = puStack_248 + 1;
                  ptrs2_1 = ptrs2_1 + 1;
                  ptrs1_3 = ptrs1_3 + 1;
                  ptrs0_5 = ptrs0_5 + 1;
                  ptrc2 = ptrc2 + 1;
                  ptrc1_1 = ptrc1_1 + 1;
                }
              }
              ptrs1_2 = cache_next;
              ptrsn1_1 = (Tfloat *)cwhd;
              ptrsn2 = (Tfloat *)(cwhd + lVar11 * 4);
              __val0_2 = ptrsn2 + lVar11;
              ptrsn0_2 = cache_next + lVar11 + lVar11;
              ptrs2 = cache_next + lVar11;
              for (val0_2 = 0.0; (int)val0_2 < (int)this->_width; val0_2 = (Tfloat)((int)val0_2 + 1)
                  ) {
                local_630 = *ptrs1_2;
                if (local_88 <= local_630) {
                  if (cache._data._4_4_ < local_630) {
                    local_630 = cache._data._4_4_;
                  }
                  local_62c = local_630;
                }
                else {
                  local_62c = local_88;
                }
                local_638 = *ptrs2;
                if (local_88 <= local_638) {
                  if (cache._data._4_4_ < local_638) {
                    local_638 = cache._data._4_4_;
                  }
                  local_634 = local_638;
                }
                else {
                  local_634 = local_88;
                }
                local_640 = *ptrsn0_2;
                if (local_88 <= local_640) {
                  if (cache._data._4_4_ < local_640) {
                    local_640 = cache._data._4_4_;
                  }
                  local_63c = local_640;
                }
                else {
                  local_63c = local_88;
                }
                ptrmin0_2._0_4_ = cimg::type<float>::max();
                ptrp0_2 = pCStack_48->_data;
                puVar8 = pCStack_48->_data + local_70;
                ptrp_end_2 = puVar8 + local_70;
                ptrp2 = puVar8;
                puVar10 = pCStack_48->_data;
                while (ptrp1_1 = puVar10, ptrp1_1 < puVar8) {
                  puVar10 = ptrp2 + 1;
                  puVar16 = ptrp_end_2 + 1;
                  fVar21 = ((float)*ptrp_end_2 - local_63c) * ((float)*ptrp_end_2 - local_63c) +
                           ((float)*ptrp1_1 - local_62c) * ((float)*ptrp1_1 - local_62c) +
                           ((float)*ptrp2 - local_634) * ((float)*ptrp2 - local_634);
                  ptrp_end_2 = puVar16;
                  ptrp2 = puVar10;
                  puVar10 = ptrp1_1 + 1;
                  if (fVar21 < ptrmin0_2._0_4_) {
                    ptrp0_2 = ptrp1_1;
                    ptrmin0_2._0_4_ = fVar21;
                  }
                }
                pbVar9 = ptrp0_2 + local_70;
                pfVar12 = ptrs1_2 + 1;
                *ptrs1_2 = local_62c;
                fVar21 = (local_62c - (float)*ptrp0_2) * valM;
                pfVar13 = ptrs2 + 1;
                *ptrs2 = local_634;
                fVar19 = (local_634 - (float)*pbVar9) * valM;
                pfVar14 = ptrsn0_2 + 1;
                *ptrsn0_2 = local_63c;
                fVar20 = (local_63c - (float)pbVar9[local_70]) * valM;
                *pfVar12 = fVar21 * 7.0 + *pfVar12;
                *pfVar13 = fVar19 * 7.0 + *pfVar13;
                *pfVar14 = fVar20 * 7.0 + *pfVar14;
                ptrsn1_1[-1] = fVar21 * 3.0 + ptrsn1_1[-1];
                ptrsn2[-1] = fVar19 * 3.0 + ptrsn2[-1];
                __val0_2[-1] = fVar20 * 3.0 + __val0_2[-1];
                pfVar15 = ptrsn1_1 + 1;
                *ptrsn1_1 = fVar21 * 5.0 + *ptrsn1_1;
                pfVar17 = ptrsn2 + 1;
                *ptrsn2 = fVar19 * 5.0 + *ptrsn2;
                pfVar18 = __val0_2 + 1;
                *__val0_2 = fVar20 * 5.0 + *__val0_2;
                *pfVar15 = fVar21 + *pfVar15;
                *pfVar17 = fVar19 + *pfVar17;
                *pfVar18 = fVar20 + *pfVar18;
                if ((local_4d & 1) == 0) {
                  *_valm = (int)ptrp0_2 - (int)pCStack_48->_data;
                }
                else {
                  *_valm = (uint)*ptrp0_2;
                  *ptrd2 = (uint)*pbVar9;
                  *_y_2 = (uint)pbVar9[local_70];
                  _y_2 = _y_2 + 1;
                  ptrd2 = ptrd2 + 1;
                }
                _valm = _valm + 1;
                __val0_2 = pfVar18;
                ptrsn2 = pfVar17;
                ptrsn1_1 = pfVar15;
                ptrsn0_2 = pfVar14;
                ptrs2 = pfVar13;
                ptrs1_2 = pfVar12;
              }
              cimg::swap<float*>(&cache_next,(float **)&cwhd);
            }
          }
        }
        else {
          for (local_2f8 = 0; (int)local_2f8 < (int)this->_depth; local_2f8 = local_2f8 + 1) {
            for (ptrc._4_4_ = 0; ptrc._4_4_ < (int)this->_height; ptrc._4_4_ = ptrc._4_4_ + 1) {
              iVar6 = height(this);
              if (ptrc._4_4_ < iVar6 + -2) {
                puStack_308 = (uint *)cwhd;
                for (_ptrc._4_4_ = 0; (int)_ptrc._4_4_ < (int)this->_spectrum;
                    _ptrc._4_4_ = _ptrc._4_4_ + 1) {
                  _ptrs = puStack_308;
                  puStack_320 = data(this,0,ptrc._4_4_ + 1,local_2f8,_ptrc._4_4_);
                  for (ptrs._4_4_ = 0; ptrs._4_4_ < (int)this->_width; ptrs._4_4_ = ptrs._4_4_ + 1)
                  {
                    *_ptrs = (uint)(float)*puStack_320;
                    puStack_320 = puStack_320 + 1;
                    _ptrs = _ptrs + 1;
                  }
                  puStack_308 = puStack_308 + lVar11;
                }
              }
              ptrsn = cache_next;
              _distmin_3 = cwhd;
              for (ptrmin._4_4_ = 0; ptrmin._4_4_ < (int)this->_width;
                  ptrmin._4_4_ = ptrmin._4_4_ + 1) {
                ptrmin._0_4_ = cimg::type<float>::max();
                ptrp = pCStack_48->_data;
                ptrp_end_3 = pCStack_48->_data;
                puVar10 = ptrp_end_3 + local_70;
                for (; ptrp_end_3 < puVar10; ptrp_end_3 = ptrp_end_3 + 1) {
                  _ptrs_2._4_4_ = 0.0;
                  _ptrp = (uchar *)ptrsn;
                  __val = ptrp_end_3;
                  for (val = 0.0; (int)val < (int)this->_spectrum; val = (Tfloat)((int)val + 1)) {
                    local_65c = *(float *)_ptrp;
                    if (local_88 <= local_65c) {
                      if (cache._data._4_4_ < local_65c) {
                        local_65c = cache._data._4_4_;
                      }
                      local_658 = local_65c;
                    }
                    else {
                      local_658 = local_88;
                    }
                    *(float *)_ptrp = local_658;
                    fVar21 = cimg::sqr<float>(local_658 - (float)*__val);
                    _ptrs_2._4_4_ = fVar21 + _ptrs_2._4_4_;
                    _ptrp = _ptrp + lVar11 * 4;
                    __val = __val + local_70;
                  }
                  if (_ptrs_2._4_4_ < ptrmin._0_4_) {
                    ptrp = ptrp_end_3;
                    ptrmin._0_4_ = _ptrs_2._4_4_;
                  }
                }
                _ptrs_1 = (Tfloat *)ptrp;
                _ptrsn = ptrsn;
                _err = (float *)(_distmin_3 - 4);
                for (_ptrd._4_4_ = 0; _ptrd._4_4_ < (int)this->_spectrum;
                    _ptrd._4_4_ = _ptrd._4_4_ + 1) {
                  pfVar12 = _ptrsn + 1;
                  fVar21 = (*_ptrsn - (float)*(byte *)_ptrs_1) * valM;
                  *pfVar12 = fVar21 * 7.0 + *pfVar12;
                  *_err = fVar21 * 3.0 + *_err;
                  pfVar13 = _err + 2;
                  _err[1] = fVar21 * 5.0 + _err[1];
                  *pfVar13 = fVar21 + *pfVar13;
                  _ptrs_1 = (Tfloat *)(local_70 + (long)_ptrs_1);
                  _ptrsn = pfVar12 + lVar11 + -1;
                  _err = pfVar13 + lVar11 + -2;
                }
                if ((local_4d & 1) == 0) {
                  *_valm = (int)ptrp - (int)pCStack_48->_data;
                }
                else {
                  _z_4 = _valm;
                  for (y_4 = 0; y_4 < (int)this->_spectrum; y_4 = y_4 + 1) {
                    *_z_4 = (uint)*ptrp;
                    _z_4 = _z_4 + pwhd;
                    ptrp = ptrp + local_70;
                  }
                }
                _valm = _valm + 1;
                _distmin_3 = _distmin_3 + 4;
                ptrsn = ptrsn + 1;
              }
              cimg::swap<float*>(&cache_next,(float **)&cwhd);
            }
          }
        }
        CImg<float>::~CImg((CImg<float> *)local_b0);
      }
    }
    return __return_storage_ptr__;
  }
  this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
  uVar1 = this->_width;
  uVar2 = this->_height;
  uVar3 = this->_depth;
  uVar4 = this->_spectrum;
  pixel_type();
  CImgArgumentException::CImgArgumentException
            (this_00,
             "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::index(): Instance and specified colormap (%u,%u,%u,%u,%p) have incompatible dimensions."
             ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4);
  __cxa_throw(this_00,&CImgArgumentException::typeinfo,CImgArgumentException::~CImgArgumentException
             );
}

Assistant:

CImg<typename CImg<t>::Tuint>
    get_index(const CImg<t>& colormap, const float dithering=1, const bool map_indexes=true) const {
      if (colormap._spectrum!=_spectrum)
        throw CImgArgumentException(_cimg_instance
                                    "index(): Instance and specified colormap (%u,%u,%u,%u,%p) "
                                    "have incompatible dimensions.",
                                    cimg_instance,
                                    colormap._width,colormap._height,colormap._depth,colormap._spectrum,colormap._data);

      typedef typename CImg<t>::Tuint tuint;
      if (is_empty()) return CImg<tuint>();
      const unsigned long whd = (unsigned long)_width*_height*_depth, pwhd = (unsigned long)colormap._width*colormap._height*colormap._depth;
      CImg<tuint> res(_width,_height,_depth,map_indexes?_spectrum:1);
      tuint *ptrd = res._data;
      if (dithering>0) { // Dithered versions.
        const float ndithering = (dithering<0?0:dithering>1?1:dithering)/16;
        Tfloat valm = 0, valM = (Tfloat)max_min(valm);
        if (valm==valM && valm>=0 && valM<=255) { valm = 0; valM = 255; }
        CImg<Tfloat> cache = get_crop(-1,0,0,0,_width,1,0,_spectrum-1);
        Tfloat *cache_current = cache.data(1,0,0,0), *cache_next = cache.data(1,1,0,0);
        const unsigned long cwhd = (unsigned long)cache._width*cache._height*cache._depth;
        switch (_spectrum) {
        case 1 : { // Optimized for scalars.
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc0 = cache_next; const T *ptrs0 = data(0,y+1,z,0);
              cimg_forX(*this,x) *(ptrc0++) = (Tfloat)*(ptrs0++);
            }
            Tfloat *ptrs0 = cache_current, *ptrsn0 = cache_next;
            cimg_forX(*this,x) {
              const Tfloat _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp_end = ptrp0 + pwhd; ptrp0<ptrp_end; ) {
                const Tfloat pval0 = (Tfloat)*(ptrp0++) - val0, dist = pval0*pval0;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const Tfloat err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering;
              *ptrs0+=7*err0; *(ptrsn0-1)+=3*err0; *(ptrsn0++)+=5*err0; *ptrsn0+=err0;
              if (map_indexes) *(ptrd++) = (tuint)*ptrmin0; else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 2 : { // Optimized for 2d vectors.
          tuint *ptrd1 = ptrd + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd;
              const T *ptrs0 = data(0,y+1,z,0), *ptrs1 = ptrs0 + whd;
              cimg_forX(*this,x) { *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0, pval1 = (Tfloat)*(ptrp1++) - val1,
                  dist = pval0*pval0 + pval1*pval1;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering;
              *ptrs0+=7*err0; *ptrs1+=7*err1;
              *(ptrsn0-1)+=3*err0; *(ptrsn1-1)+=3*err1;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1;
              *ptrsn0+=err0; *ptrsn1+=err1;
              if (map_indexes) { *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; }
              else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        case 3 : { // Optimized for 3d vectors (colors).
          tuint *ptrd1 = ptrd + whd, *ptrd2 = ptrd1 + whd;
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc0 = cache_next, *ptrc1 = ptrc0 + cwhd, *ptrc2 = ptrc1 + cwhd;
              const T *ptrs0 = data(0,y+1,z,0), *ptrs1 = ptrs0 + whd, *ptrs2 = ptrs1 + whd;
              cimg_forX(*this,x) { *(ptrc0++) = (Tfloat)*(ptrs0++); *(ptrc1++) = (Tfloat)*(ptrs1++); *(ptrc2++) = (Tfloat)*(ptrs2++); }
            }
            Tfloat
              *ptrs0 = cache_current, *ptrs1 = ptrs0 + cwhd, *ptrs2 = ptrs1 + cwhd,
              *ptrsn0 = cache_next, *ptrsn1 = ptrsn0 + cwhd, *ptrsn2 = ptrsn1 + cwhd;
            cimg_forX(*this,x) {
              const Tfloat
                _val0 = (Tfloat)*ptrs0, val0 = _val0<valm?valm:_val0>valM?valM:_val0,
                _val1 = (Tfloat)*ptrs1, val1 = _val1<valm?valm:_val1>valM?valM:_val1,
                _val2 = (Tfloat)*ptrs2, val2 = _val2<valm?valm:_val2>valM?valM:_val2;
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin0 = colormap._data;
              for (const t *ptrp0 = colormap._data, *ptrp1 = ptrp0 + pwhd, *ptrp2 = ptrp1 + pwhd, *ptrp_end = ptrp1; ptrp0<ptrp_end; ) {
                const Tfloat
                  pval0 = (Tfloat)*(ptrp0++) - val0, pval1 = (Tfloat)*(ptrp1++) - val1, pval2 = (Tfloat)*(ptrp2++) - val2,
                  dist = pval0*pval0 + pval1*pval1 + pval2*pval2;
                if (dist<distmin) { ptrmin0 = ptrp0 - 1; distmin = dist; }
              }
              const t *const ptrmin1 = ptrmin0 + pwhd, *const ptrmin2 = ptrmin1 + pwhd;
              const Tfloat
                err0 = ((*(ptrs0++)=val0) - (Tfloat)*ptrmin0)*ndithering,
                err1 = ((*(ptrs1++)=val1) - (Tfloat)*ptrmin1)*ndithering,
                err2 = ((*(ptrs2++)=val2) - (Tfloat)*ptrmin2)*ndithering;

              *ptrs0+=7*err0; *ptrs1+=7*err1; *ptrs2+=7*err2;
              *(ptrsn0-1)+=3*err0; *(ptrsn1-1)+=3*err1; *(ptrsn2-1)+=3*err2;
              *(ptrsn0++)+=5*err0; *(ptrsn1++)+=5*err1; *(ptrsn2++)+=5*err2;
              *ptrsn0+=err0; *ptrsn1+=err1; *ptrsn2+=err2;

              if (map_indexes) { *(ptrd++) = (tuint)*ptrmin0; *(ptrd1++) = (tuint)*ptrmin1; *(ptrd2++) = (tuint)*ptrmin2; }
              else *(ptrd++) = (tuint)(ptrmin0 - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        } break;
        default : // Generic version
          cimg_forYZ(*this,y,z) {
            if (y<height()-2) {
              Tfloat *ptrc = cache_next;
              cimg_forC(*this,c) {
                Tfloat *_ptrc = ptrc; const T *_ptrs = data(0,y+1,z,c);
                cimg_forX(*this,x) *(_ptrc++) = (Tfloat)*(_ptrs++);
                ptrc+=cwhd;
              }
            }
            Tfloat *ptrs = cache_current, *ptrsn = cache_next;
            cimg_forX(*this,x) {
              Tfloat distmin = cimg::type<Tfloat>::max(); const t *ptrmin = colormap._data;
              for (const t *ptrp = colormap._data, *ptrp_end = ptrp + pwhd; ptrp<ptrp_end; ++ptrp) {
                Tfloat dist = 0; Tfloat *_ptrs = ptrs; const t *_ptrp = ptrp;
                cimg_forC(*this,c) {
                  const Tfloat _val = *_ptrs, val = _val<valm?valm:_val>valM?valM:_val;
                  dist+=cimg::sqr((*_ptrs=val) - (Tfloat)*_ptrp); _ptrs+=cwhd; _ptrp+=pwhd;
                }
                if (dist<distmin) { ptrmin = ptrp; distmin = dist; }
              }
              const t *_ptrmin = ptrmin; Tfloat *_ptrs = ptrs++, *_ptrsn = (ptrsn++)-1;
              cimg_forC(*this,c) {
                const Tfloat err = (*(_ptrs++) - (Tfloat)*_ptrmin)*ndithering;
                *_ptrs+=7*err; *(_ptrsn++)+=3*err; *(_ptrsn++)+=5*err; *_ptrsn+=err;
                _ptrmin+=pwhd; _ptrs+=cwhd-1; _ptrsn+=cwhd-2;
              }
              if (map_indexes) {
                tuint *_ptrd = ptrd++;
                cimg_forC(*this,c) { *_ptrd = (tuint)*ptrmin; _ptrd+=whd; ptrmin+=pwhd; }
              }
              else *(ptrd++) = (tuint)(ptrmin - colormap._data);
            }
            cimg::swap(cache_current,cache_next);
          }
        }